

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::TemperatureGroup> *
metaf::TemperatureGroup::parse
          (optional<metaf::TemperatureGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  double dVar2;
  unkuint10 Var3;
  _Alloc_hider _Var4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  pointer psVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  _Optional_payload_base<int> _Var12;
  undefined1 uVar13;
  undefined2 uVar14;
  uint value_1;
  undefined1 uVar15;
  uint value;
  int iVar16;
  int iVar17;
  optional<metaf::Temperature> oVar18;
  smatch match;
  undefined1 local_88;
  string_type local_78;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rgx_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rgx_abi_cxx11_), iVar7 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                rgx_abi_cxx11_,"(M?\\d\\d|//)/(M?\\d\\d|//)?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rgx_abi_cxx11_);
  }
  if ((parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
       rmkRgx_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                                   ::rmkRgx_abi_cxx11_), iVar7 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)::
                rmkRgx_abi_cxx11_,"T([01]\\d\\d\\d)([01]\\d\\d\\d)?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                  ::rmkRgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                         ::rmkRgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (reportPart == RMK) {
    iVar7 = std::__cxx11::string::compare((char *)group);
    if (iVar7 == 0) {
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp = T_MISG;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)group);
      if (iVar7 != 0) {
        _Var1._M_current = (group->_M_dataplus)._M_p;
        bVar6 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var1._M_current + group->_M_string_length),&local_58,
                           &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                            ::rmkRgx_abi_cxx11_,0);
        if (bVar6) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_78,&local_58,1);
          _Var4._M_p = local_78._M_dataplus._M_p;
          if ((local_78._M_string_length == 4) && ((*local_78._M_dataplus._M_p & 0xfeU) == 0x30)) {
            lVar9 = 1;
            iVar7 = 0;
            do {
              if (9 < (byte)(local_78._M_dataplus._M_p[lVar9] - 0x30U)) goto LAB_001afc99;
              iVar7 = (uint)(byte)(local_78._M_dataplus._M_p[lVar9] - 0x30U) + iVar7 * 10;
              lVar9 = lVar9 + 1;
            } while ((int)lVar9 != 4);
            iVar17 = -iVar7;
            if (*local_78._M_dataplus._M_p != 0x31) {
              iVar17 = iVar7;
            }
            dVar2 = round((double)((float)iVar17 / 10.0) * 10.0);
            iVar7 = (int)dVar2;
            uVar11 = (ulong)((float)iVar17 / 10.0 < 0.0) + 0x100000100;
            local_88 = 1;
          }
          else {
LAB_001afc99:
            iVar7 = 0;
            uVar11 = 0;
            local_88 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var4._M_p != &local_78.field_2) {
            operator_delete(_Var4._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((uVar11 & 0x100000000) != 0) {
            lVar9 = (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            if ((lVar9 == 0) || (0xfffffffffffffffc < (lVar9 >> 3) * -0x5555555555555555 - 6U)) {
              psVar8 = (pointer)((long)local_58.
                                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
            }
            else {
              psVar8 = local_58.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2;
            }
            Var3 = (unkuint10)0;
            if ((psVar8->matched == true) &&
               (Var3 = (unkuint10)0,
               (psVar8->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).second._M_current !=
               (psVar8->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current)) {
              std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::str(&local_78,&local_58,2);
              oVar18 = Temperature::fromRemarkString(&local_78);
              Var3 = oVar18.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                     super__Optional_payload_base<metaf::Temperature>._M_payload._0_10_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if (((undefined1  [16])
                   oVar18.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::Temperature> & (undefined1  [16])0x100000000)
                  == (undefined1  [16])0x0) goto LAB_001afd5f;
            }
            (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp
                 = TEMPERATURE_AND_DEW_POINT;
            *(int *)&(__return_storage_ptr__->
                     super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.t.
                     tempValue.super__Optional_base<int,_true,_true>._M_payload = iVar7;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) =
                 local_88;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xb) = 0;
            *(undefined2 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 9) = 0;
            *(char *)((long)&(__return_storage_ptr__->
                             super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                             super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc)
                 = (char)uVar11;
            *(char *)((long)&(__return_storage_ptr__->
                             super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                             super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xd)
                 = (char)(uVar11 >> 8);
            (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.
            tempValue.super__Optional_base<int,_true,_true>._M_payload =
                 (_Optional_payload_base<int>)SUB108(Var3,0);
            *(short *)((long)&(__return_storage_ptr__->
                              super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                              super__Optional_payload_base<metaf::TemperatureGroup>._M_payload +
                      0x18) = (short)(Var3 >> 0x40);
            (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.
            isIncomplete = false;
            goto LAB_001afff0;
          }
        }
LAB_001afd5f:
        (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload =
             (_Optional_payload<int,_true,_true,_true>)0x0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.
          freezing = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)
                 ._M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload.
                 _M_value.t.tempValue.super__Optional_base<int,_true,_true> + 4) = 0;
        *(undefined4 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = 0;
        goto LAB_001afd70;
      }
      (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload
      .super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp = TD_MISG;
    }
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) = 0;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x14) = 0
    ;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x18) = 0
    ;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.isIncomplete = true;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = true;
  }
  else {
    if ((reportPart != METAR) ||
       (_Var1._M_current = (group->_M_dataplus)._M_p,
       bVar6 = std::__detail::
               __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                         (_Var1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(_Var1._M_current + group->_M_string_length),&local_58,
                          &parse(std::__cxx11::string_const&,metaf::ReportPart,metaf::ReportMetadata_const&)
                           ::rgx_abi_cxx11_,0), !bVar6)) goto LAB_001afd5f;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_78,&local_58,1);
    iVar7 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar7 == 0) {
      bVar6 = false;
      iVar7 = 0;
LAB_001afd3c:
      iVar17 = iVar7;
      uVar15 = 0;
      uVar13 = 0;
    }
    else {
      iVar17 = 0;
      if (local_78._M_string_length == 2) {
        lVar9 = 0;
        do {
          bVar6 = 9 < (byte)(local_78._M_dataplus._M_p[lVar9] - 0x30U);
          iVar7 = iVar17;
          if (bVar6) goto LAB_001afd3c;
          iVar17 = (uint)(byte)(local_78._M_dataplus._M_p[lVar9] - 0x30U) + iVar17 * 10;
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 != 2);
        uVar13 = 1;
        uVar15 = 0;
      }
      else {
        bVar6 = true;
        iVar7 = 0;
        if ((local_78._M_string_length != 3) ||
           (iVar16 = 0, iVar7 = iVar17, *local_78._M_dataplus._M_p != 0x4d)) goto LAB_001afd3c;
        lVar9 = 0;
        do {
          if (9 < (byte)(local_78._M_dataplus._M_p[lVar9 + 1] - 0x30U)) goto LAB_001afd3c;
          iVar16 = (uint)(byte)(local_78._M_dataplus._M_p[lVar9 + 1] - 0x30U) + iVar16 * 10;
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 != 2);
        iVar17 = -iVar16;
        uVar15 = 1;
        bVar6 = false;
        uVar13 = 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) goto LAB_001afd5f;
    lVar9 = (long)local_58.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar9 == 0) || (0xfffffffffffffffc < (lVar9 >> 3) * -0x5555555555555555 - 6U)) {
      psVar8 = (pointer)((long)local_58.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
    }
    else {
      psVar8 = local_58.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2;
    }
    _Var12._M_payload = (_Storage<int,_true>)0x0;
    _Var12._M_engaged = false;
    _Var12._5_3_ = 0;
    uVar14 = 0;
    if ((psVar8->matched == true) &&
       ((psVar8->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).second._M_current !=
        (psVar8->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).first._M_current)) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_78,&local_58,2);
      iVar7 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar7 == 0) {
        bVar6 = false;
        uVar5 = 0;
LAB_001aff8a:
        uVar10 = uVar5;
        uVar14 = 0;
        uVar11 = 0;
      }
      else {
        uVar10 = 0;
        if (local_78._M_string_length == 2) {
          uVar11 = 0x100000000;
          lVar9 = 0;
          do {
            bVar6 = 9 < (byte)(local_78._M_dataplus._M_p[lVar9] - 0x30U);
            uVar5 = uVar10;
            if (bVar6) goto LAB_001aff8a;
            uVar10 = (uint)(byte)(local_78._M_dataplus._M_p[lVar9] - 0x30U) + uVar10 * 10;
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 != 2);
          uVar14 = 0;
        }
        else {
          bVar6 = true;
          uVar5 = 0;
          if ((local_78._M_string_length != 3) ||
             (iVar7 = 0, uVar5 = uVar10, *local_78._M_dataplus._M_p != 0x4d)) goto LAB_001aff8a;
          lVar9 = 0;
          do {
            if (9 < (byte)(local_78._M_dataplus._M_p[lVar9 + 1] - 0x30U)) goto LAB_001aff8a;
            iVar7 = (uint)(byte)(local_78._M_dataplus._M_p[lVar9 + 1] - 0x30U) + iVar7 * 10;
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 != 2);
          uVar11 = 0x100000000;
          uVar10 = -iVar7;
          uVar14 = 1;
          bVar6 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) goto LAB_001afd5f;
      _Var12 = (_Optional_payload_base<int>)(uVar11 | uVar10);
    }
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.tp =
         TEMPERATURE_AND_DEW_POINT;
    *(int *)((long)&(__return_storage_ptr__->
                    super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
                    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 4) = iVar17;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 8) =
         uVar13;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xb) = 0;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 9) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xc) =
         uVar15;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0xd) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.dp.tempValue.
    super__Optional_base<int,_true,_true>._M_payload =
         (_Optional_payload<int,_true,_true,_true>)_Var12;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::TemperatureGroup>._M_payload + 0x18) =
         uVar14;
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_payload._M_value.isIncomplete = false;
LAB_001afff0:
    (__return_storage_ptr__->super__Optional_base<metaf::TemperatureGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TemperatureGroup>._M_engaged = true;
  }
LAB_001afd70:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<TemperatureGroup> TemperatureGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	static const std::optional<TemperatureGroup> notRecognised;
	static const std::regex rgx("(M?\\d\\d|//)/(M?\\d\\d|//)?");
	static const auto matchTemperature = 1, matchDewPoint = 2;
	static const std::regex rmkRgx("T([01]\\d\\d\\d)([01]\\d\\d\\d)?");
	static const auto rmkMatchTemperature = 1, rmkMatchDewPoint = 2;
	std::smatch match;
	if (reportPart == ReportPart::METAR) {
		if (regex_match(group, match, rgx)) {
			const auto t = Temperature::fromString(match.str(matchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result(Type::TEMPERATURE_AND_DEW_POINT);
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromString(match.str(matchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	if (reportPart == ReportPart::RMK) {
		if (group == "T") return TemperatureGroup(Type::T_MISG, true);
		if (group == "TD") return TemperatureGroup(Type::TD_MISG, true);
		if (regex_match(group, match, rmkRgx)) {
			const auto t = Temperature::fromRemarkString(match.str(rmkMatchTemperature));
			if (!t.has_value()) return notRecognised;
			TemperatureGroup result;
			result.t = *t;
			if (match.length(matchDewPoint)) {
				const auto dp = Temperature::fromRemarkString(match.str(rmkMatchDewPoint));
				if (!dp.has_value()) return notRecognised;
				result.dp = *dp;
			}
			return result;
		}
	}
	return notRecognised;
}